

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rolemaskproxymodel.cpp
# Opt level: O2

void RoleMaskProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<int> *this;
  QList<int> *newRoles;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  RoleMaskProxyModel *_t;
  undefined8 *puVar6;
  QArrayDataPointer<int> QStack_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      mergeDisplayEditChanged((RoleMaskProxyModel *)_o,*_a[1]);
      return;
    case 1:
      transparentIfEmptyChanged((RoleMaskProxyModel *)_o,*_a[1]);
      return;
    case 2:
      maskHeaderDataChanged((RoleMaskProxyModel *)_o,*_a[1]);
      return;
    case 3:
      maskedRolesChanged((RoleMaskProxyModel *)_o);
      return;
    case 4:
      maskedDataChanged((RoleMaskProxyModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2],
                        (QVector<int> *)_a[3]);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 4) {
      this = (QArrayDataPointer<int> *)*_a;
      switch(_id) {
      case 0:
        bVar4 = transparentIfEmpty((RoleMaskProxyModel *)_o);
        break;
      case 1:
        bVar4 = mergeDisplayEdit((RoleMaskProxyModel *)_o);
        break;
      case 2:
        bVar4 = maskHeaderData((RoleMaskProxyModel *)_o);
        break;
      case 3:
        maskedRoles((QList<int> *)&QStack_28,(RoleMaskProxyModel *)_o);
        QArrayDataPointer<int>::operator=(this,&QStack_28);
        QArrayDataPointer<int>::~QArrayDataPointer(&QStack_28);
        return;
      }
      *(bool *)&this->d = bVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      newRoles = (QList<int> *)*_a;
      switch(_id) {
      case 0:
        setTransparentIfEmpty((RoleMaskProxyModel *)_o,*(bool *)&(newRoles->d).d);
        return;
      case 1:
        setMergeDisplayEdit((RoleMaskProxyModel *)_o,*(bool *)&(newRoles->d).d);
        return;
      case 2:
        setMaskHeaderData((RoleMaskProxyModel *)_o,*(bool *)&(newRoles->d).d);
        return;
      case 3:
        setMaskedRoles((RoleMaskProxyModel *)_o,newRoles);
        return;
      }
    }
    break;
  case ResetProperty:
    if (_id == 3) {
      clearMaskedRoles((RoleMaskProxyModel *)_o);
      return;
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == mergeDisplayEditChanged && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == transparentIfEmptyChanged && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == maskHeaderDataChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == maskedRolesChanged && lVar3 == 0) {
      *puVar1 = 3;
    }
    else if (pcVar2 == maskedDataChanged && lVar3 == 0) {
      *puVar1 = 4;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 3) {
      iVar5 = qMetaTypeId<QList<int>>();
      *(int *)*_a = iVar5;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 4) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 2) {
        *puVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<int>_>::metaType;
        return;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void RoleMaskProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->mergeDisplayEditChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->transparentIfEmptyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->maskHeaderDataChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->maskedRolesChanged(); break;
        case 4: _t->maskedDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::mergeDisplayEditChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::transparentIfEmptyChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskHeaderDataChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskedRolesChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (RoleMaskProxyModel::*)(const QModelIndex & , const QModelIndex & , const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RoleMaskProxyModel::maskedDataChanged)) {
                *result = 4;
                return;
            }
        }
    } else if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QList<int> >(); break;
        }
    }

#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->transparentIfEmpty(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->mergeDisplayEdit(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->maskHeaderData(); break;
        case 3: *reinterpret_cast< QList<int>*>(_v) = _t->maskedRoles(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTransparentIfEmpty(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setMergeDisplayEdit(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setMaskHeaderData(*reinterpret_cast< bool*>(_v)); break;
        case 3: _t->setMaskedRoles(*reinterpret_cast< QList<int>*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<RoleMaskProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 3: _t->clearMaskedRoles(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}